

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_setup_connection(connectdata *conn)

{
  CURLcode result;
  connectdata *conn_local;
  
  conn_local._4_4_ = pop3_init(conn);
  if (conn_local._4_4_ == CURLE_OK) {
    conn->tls_upgraded = false;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_setup_connection(struct connectdata *conn)
{
  /* Initialise the POP3 layer */
  CURLcode result = pop3_init(conn);
  if(result)
    return result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;

  return CURLE_OK;
}